

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuGitter.cpp
# Opt level: O2

SudokuGitter * __thiscall
SudokuGitter::getSolvable(SudokuGitter *__return_storage_ptr__,SudokuGitter *this)

{
  pointer pvVar1;
  pointer pvVar2;
  long lVar3;
  pointer __first;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  uint col;
  ulong uVar7;
  uint uVar8;
  double dVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> permutation;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_2748;
  random_device local_2730;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13a8;
  
  SudokuGitter(__return_storage_ptr__,this->elements);
  uVar8 = this->elements * this->elements;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2748,(long)(int)uVar8,
             (allocator_type *)&local_13a8);
  dVar9 = ceil((double)(int)uVar8 * 0.3);
  __first = local_2748._M_impl.super__Vector_impl_data._M_start;
  uVar5 = 0;
  uVar4 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    local_2748._M_impl.super__Vector_impl_data._M_start[uVar5] = (uint)((double)(int)uVar5 < dVar9);
  }
  std::random_device::random_device(&local_2730);
  uVar8 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_13a8,(ulong)uVar8);
  std::
  shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__first,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )local_2748._M_impl.super__Vector_impl_data._M_finish,&local_13a8);
  std::random_device::~random_device(&local_2730);
  uVar4 = (ulong)this->elements;
  lVar6 = 0;
  for (uVar5 = 0; uVar5 != uVar4; uVar5 = uVar5 + 1) {
    pvVar1 = (__return_storage_ptr__->cells).
             super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar2 = (this->cells).
             super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
      if ((local_2748._M_impl.super__Vector_impl_data._M_start[(uint)((int)lVar6 + (int)uVar7)] == 1
          ) && (lVar3 = *(long *)&pvVar1[uVar5].super__Vector_base<cell,_std::allocator<cell>_>.
                                  _M_impl, *(char *)(lVar3 + 4 + uVar7 * 8) == '\0')) {
        *(undefined4 *)(lVar3 + uVar7 * 8) =
             *(undefined4 *)
              (*(long *)&pvVar2[uVar5].super__Vector_base<cell,_std::allocator<cell>_>._M_impl +
              uVar7 * 8);
      }
    }
    lVar6 = lVar6 + uVar4;
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_2748);
  return __return_storage_ptr__;
}

Assistant:

SudokuGitter SudokuGitter::getSolvable() {
    SudokuGitter solvable = SudokuGitter(getElements());

    int globalElements = getElements() * getElements();

    vector<unsigned int> permutation(globalElements);

    for (int i = 0; i < globalElements; i++) {
        if (i < ceil(globalElements * 0.30))
            permutation[i] = 1;
        else
            permutation[i] = 0;
    }

    shuffle(begin(permutation), end(permutation), std::mt19937(std::random_device()()));

    for (unsigned int row = 0; row < getElements(); row++) {
        for (unsigned int col = 0; col < getElements(); col++) {
            if (permutation[row * getElements() + col] == 1)
                solvable.setCell(row, col, getCellValue(row, col));
        }
    }

    return solvable;
}